

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceContextBase.cpp
# Opt level: O3

bool Diligent::VerifyDispatchComputeAttribs(DispatchComputeAttribs *Attribs)

{
  string _msg;
  string local_28;
  
  if (Attribs->ThreadGroupCountX == 0) {
    FormatString<char[125]>
              (&local_28,
               (char (*) [125])
               "DispatchComputeAttribs.ThreadGroupCountX is 0. This is OK as the dispatch command will be ignored, but may be unintentional."
              );
    if (DebugMessageCallback != (undefined *)0x0) {
      (*(code *)DebugMessageCallback)(0,local_28._M_dataplus._M_p,0,0,0);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_28._M_dataplus._M_p != &local_28.field_2) {
      operator_delete(local_28._M_dataplus._M_p,local_28.field_2._M_allocated_capacity + 1);
    }
  }
  if (Attribs->ThreadGroupCountY == 0) {
    FormatString<char[125]>
              (&local_28,
               (char (*) [125])
               "DispatchComputeAttribs.ThreadGroupCountY is 0. This is OK as the dispatch command will be ignored, but may be unintentional."
              );
    if (DebugMessageCallback != (undefined *)0x0) {
      (*(code *)DebugMessageCallback)(0,local_28._M_dataplus._M_p,0,0,0);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_28._M_dataplus._M_p != &local_28.field_2) {
      operator_delete(local_28._M_dataplus._M_p,local_28.field_2._M_allocated_capacity + 1);
    }
  }
  if (Attribs->ThreadGroupCountZ == 0) {
    FormatString<char[125]>
              (&local_28,
               (char (*) [125])
               "DispatchComputeAttribs.ThreadGroupCountZ is 0. This is OK as the dispatch command will be ignored, but may be unintentional."
              );
    if (DebugMessageCallback != (undefined *)0x0) {
      (*(code *)DebugMessageCallback)(0,local_28._M_dataplus._M_p,0,0,0);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_28._M_dataplus._M_p != &local_28.field_2) {
      operator_delete(local_28._M_dataplus._M_p,local_28.field_2._M_allocated_capacity + 1);
    }
  }
  return true;
}

Assistant:

bool VerifyDispatchComputeAttribs(const DispatchComputeAttribs& Attribs)
{
    if (Attribs.ThreadGroupCountX == 0)
        LOG_INFO_MESSAGE("DispatchComputeAttribs.ThreadGroupCountX is 0. This is OK as the dispatch command will be ignored, but may be unintentional.");
    if (Attribs.ThreadGroupCountY == 0)
        LOG_INFO_MESSAGE("DispatchComputeAttribs.ThreadGroupCountY is 0. This is OK as the dispatch command will be ignored, but may be unintentional.");
    if (Attribs.ThreadGroupCountZ == 0)
        LOG_INFO_MESSAGE("DispatchComputeAttribs.ThreadGroupCountZ is 0. This is OK as the dispatch command will be ignored, but may be unintentional.");

    return true;
}